

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::solveUleftNoNZ
          (CLUFactor<double> *this,double eps,double *vec,double *rhs,int *rhsidx,int rhsn)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  pointer pdVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  int local_b0;
  int local_ac;
  CLUFactor<double> *local_a8;
  int *local_a0;
  double local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  pointer local_78;
  int *local_70;
  double *local_68;
  int *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_70 = (this->row).orig;
  local_60 = (this->col).orig;
  local_a0 = (this->col).perm;
  local_ac = 0;
  local_b0 = rhsn;
  local_a8 = this;
  local_98 = eps;
  local_68 = vec;
  while (local_ac < rhsn) {
    enQueueMin(rhsidx,&local_ac,local_a0[rhsidx[local_ac]]);
  }
  local_78 = (local_a8->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_80 = (local_a8->u).row.idx;
  local_88 = (local_a8->u).row.len;
  local_90 = (local_a8->u).row.start;
  while (0 < rhsn) {
    iVar5 = deQueueMin(rhsidx,&local_b0);
    pdVar4 = local_78;
    piVar3 = local_80;
    dVar9 = rhs[local_60[iVar5]];
    rhs[local_60[iVar5]] = 0.0;
    rhsn = local_b0;
    if (local_98 < ABS(dVar9)) {
      iVar5 = local_70[iVar5];
      local_48 = dVar9 * (local_a8->diag).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar5];
      local_68[iVar5] = local_48;
      iVar1 = local_90[iVar5];
      iVar5 = local_88[iVar5];
      uStack_40 = 0;
      dVar9 = -local_48;
      uStack_50 = 0x8000000000000000;
      local_58 = dVar9;
      for (lVar6 = 0; rhsn = local_b0, iVar5 != (int)lVar6; lVar6 = lVar6 + 1) {
        iVar2 = piVar3[iVar1 + lVar6];
        dVar8 = rhs[iVar2];
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar8 = dVar8 - pdVar4[iVar1 + lVar6] * local_48;
          uVar7 = -(ulong)(dVar8 != 0.0);
          rhs[iVar2] = (double)(~uVar7 & 0x2b2bff2ee48e0530 | (ulong)dVar8 & uVar7);
        }
        else {
          dVar8 = pdVar4[iVar1 + lVar6] * dVar9;
          if (local_98 < ABS(dVar8)) {
            rhs[iVar2] = dVar8;
            enQueueMin(rhsidx,&local_b0,local_a0[iVar2]);
            dVar9 = local_58;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleftNoNZ(R eps, R* vec,
                                  R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }
}